

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestExtensionOrderings2::~TestExtensionOrderings2(TestExtensionOrderings2 *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.my_string_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.cc"
             ,0x716f,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestExtensionOrderings2::~TestExtensionOrderings2() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestExtensionOrderings2)
  SharedDtor(*this);
}